

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O1

ngx_chain_t * ngx_alloc_chain_link(ngx_pool_t *pool)

{
  ngx_chain_t *pnVar1;
  
  pnVar1 = pool->chain;
  if (pnVar1 != (ngx_chain_t *)0x0) {
    pool->chain = pnVar1->next;
    return pnVar1;
  }
  pnVar1 = (ngx_chain_t *)ngx_palloc(pool,0x10);
  return pnVar1;
}

Assistant:

ngx_chain_t *
ngx_alloc_chain_link(ngx_pool_t *pool)
{
    ngx_chain_t  *cl;

    cl = pool->chain;

    if (cl) {
        pool->chain = cl->next;
        return cl;
    }

    cl = ngx_palloc(pool, sizeof(ngx_chain_t));
    if (cl == NULL) {
        return NULL;
    }

    return cl;
}